

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::LoopTestOverS<unsigned_short,false,2u>
          (StorageMultisampleTest *this,bool skip_rgb)

{
  bool bVar1;
  GLuint GVar2;
  GLchar *pGVar3;
  GLchar *pGVar4;
  bool local_12;
  bool result;
  bool skip_rgb_local;
  StorageMultisampleTest *this_local;
  
  pGVar3 = FragmentShaderDeclarationMultisample<unsigned_short,false,2u>();
  pGVar4 = FragmentShaderTail<2u>();
  GVar2 = PrepareProgram(this,pGVar3,pGVar4);
  this->m_po_ms = GVar2;
  pGVar3 = FragmentShaderDeclarationAuxiliary<unsigned_short,false,2u>();
  pGVar4 = FragmentShaderTail<2u>();
  GVar2 = PrepareProgram(this,pGVar3,pGVar4);
  this->m_po_aux = GVar2;
  local_12 = Test<unsigned_short,1,false,2u>(this);
  bVar1 = Test<unsigned_short,2,false,2u>(this);
  local_12 = local_12 && bVar1;
  if (!skip_rgb) {
    bVar1 = Test<unsigned_short,3,false,2u>(this);
    local_12 = local_12 && bVar1;
  }
  bVar1 = Test<unsigned_short,4,false,2u>(this);
  CleanPrograms(this);
  CleanErrors(this);
  return (local_12 & bVar1) != 0;
}

Assistant:

bool StorageMultisampleTest::LoopTestOverS(bool skip_rgb)
{
	/* Prepare one program to create multisample texture and one to copy it to regular texture. */
	m_po_ms  = PrepareProgram(FragmentShaderDeclarationMultisample<T, N, D>(), FragmentShaderTail<D>());
	m_po_aux = PrepareProgram(FragmentShaderDeclarationAuxiliary<T, N, D>(), FragmentShaderTail<D>());

	/* Run tests. */
	bool result = true;

	result &= Test<T, 1, N, D>();

	result &= Test<T, 2, N, D>();

	if (!skip_rgb)
	{
		result &= Test<T, 3, N, D>();
	}

	result &= Test<T, 4, N, D>();

	/* Cleanup.*/
	CleanPrograms();
	CleanErrors();

	/* Pass result. */
	return result;
}